

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O3

void __thiscall rcg::CPort::Read(CPort *this,void *buffer,int64_t addr,int64_t length)

{
  GC_ERROR GVar1;
  ostream *poVar2;
  GenTLException *pGVar3;
  ostringstream out;
  ulong local_1c8;
  string local_1c0;
  string local_1a0 [11];
  
  if (*this->port == (PORT_HANDLE)0x0) {
    pGVar3 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"CPort::Read(): Port has been closed","");
    GenTLException::GenTLException(pGVar3,local_1a0);
    __cxa_throw(pGVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  local_1c8 = length;
  GVar1 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->GCReadPort)(*this->port,addr,buffer,&local_1c8);
  if (GVar1 == 0) {
    if (local_1c8 != 0) {
      if (local_1c8 <= (ulong)length && length - local_1c8 != 0) {
        memset((void *)((long)buffer + local_1c8),0,length - local_1c8);
      }
      return;
    }
    pGVar3 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"CPort::Read(): Returned size is 0","");
    GenTLException::GenTLException(pGVar3,local_1a0);
    __cxa_throw(pGVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"CPort::Read(address=0x",0x16);
  *(uint *)((long)&local_1a0[0].field_2 + *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_1a0[0].field_2 + *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<long>((long)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", length=",9);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  pGVar3 = (GenTLException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  GenTLException::GenTLException(pGVar3,&local_1c0,&this->gentl);
  __cxa_throw(pGVar3,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

void CPort::Read(void *buffer, int64_t addr, int64_t length)
{
  size_t size=0;

  if (*port != 0)
  {
    int retry=1;
    GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

    while (err != GenTL::GC_ERR_SUCCESS && retry > 0)
    {
      retry--;

      size=static_cast<size_t>(length);
      err=gentl->GCReadPort(*port, static_cast<uint64_t>(addr), buffer, &size);
    }

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      std::ostringstream out;
      out << "CPort::Read(address=0x" << std::hex << addr << ", length=" <<
        std::dec << static_cast<size_t>(length) << ")";

      throw GenTLException(out.str(), gentl);
    }

    if (size == 0)
    {
      throw GenTLException("CPort::Read(): Returned size is 0");
    }

    while (size < static_cast<size_t>(length))
    {
      reinterpret_cast<uint8_t *>(buffer)[size++]=0;
    }
  }
  else
  {
    throw GenTLException("CPort::Read(): Port has been closed");
  }
}